

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

ExpEmit __thiscall FxCompareEq::Emit(FxCompareEq *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  undefined2 uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  int opcode;
  uint uVar7;
  ExpEmit op2;
  ExpEmit op1;
  ExpEmit temp;
  
  uVar3 = (*((this->super_FxBinary).left)->_vptr_FxExpression[7])();
  op1._0_2_ = SUB42(uVar3,0);
  uVar7 = uVar3 >> 0x10;
  op1._2_1_ = SUB41(uVar3 >> 0x10,0);
  pFVar1 = (this->super_FxBinary).right;
  iVar4 = (*pFVar1->_vptr_FxExpression[7])(pFVar1,build);
  uVar2 = (undefined2)iVar4;
  bVar5 = (byte)((uint)iVar4 >> 0x10);
  bVar6 = (byte)(uVar3 >> 8);
  op2._0_2_ = uVar2;
  op2._2_1_ = bVar5;
  if (bVar6 != (byte)((uint)iVar4 >> 8)) {
    __assert_fail("op1.RegType == op2.RegType",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x6f7,"virtual ExpEmit FxCompareEq::Emit(VMFunctionBuilder *)");
  }
  if ((bVar6 < 4) && ((uVar3 >> 8 & 0xff) != 2)) {
    if ((uVar7 & 1) != 0) {
      uVar7 = (uint)bVar5;
      op2.RegNum = op1.RegNum;
      op2.RegType = op1.RegType;
      op2._2_1_ = op1._2_1_;
      op1._0_2_ = uVar2;
      op1._2_1_ = bVar5;
    }
    if ((uVar7 & 1) == 0) {
      uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
      iVar4 = 0xb3;
      if (op1.RegType == '\x01') {
        iVar4 = 0x97;
      }
      opcode = 0x73;
      if (op1.RegType != '\0') {
        opcode = iVar4;
      }
      ExpEmit::Free(&op1,build);
      if ((op2._2_1_ & 1) == 0) {
        ExpEmit::Free(&op2,build);
      }
      else {
        opcode = opcode + 1;
      }
      uVar3 = uVar3 & 0xff;
      VMFunctionBuilder::Emit(build,1,uVar3,0,0);
      VMFunctionBuilder::Emit
                (build,opcode,
                 (uint)(*(int *)&(this->super_FxBinary).super_FxExpression.field_0x34 != 0x11f),
                 (uint)op1.RegNum,(uint)op2.RegNum);
      VMFunctionBuilder::Emit(build,0x37,1);
      VMFunctionBuilder::Emit(build,1,uVar3,1);
      return SUB43(uVar3,0);
    }
    __assert_fail("!op1.Konst",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x700,"virtual ExpEmit FxCompareEq::Emit(VMFunctionBuilder *)");
  }
  __assert_fail("op1.RegType == REGT_INT || op1.RegType == REGT_FLOAT || op1.RegType == REGT_POINTER"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x6f8,"virtual ExpEmit FxCompareEq::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxCompareEq::Emit(VMFunctionBuilder *build)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	assert(op1.RegType == op2.RegType);
	assert(op1.RegType == REGT_INT || op1.RegType == REGT_FLOAT || op1.RegType == REGT_POINTER);
	int instr;

	// Only the second operand may be constant.
	if (op1.Konst)
	{
		swapvalues(op1, op2);
	}
	assert(!op1.Konst);

	ExpEmit to(build, REGT_INT);

	instr = op1.RegType == REGT_INT ? OP_EQ_R :
			op1.RegType == REGT_FLOAT ? OP_EQF_R :
			OP_EQA_R;
	op1.Free(build);
	if (!op2.Konst)
	{
		op2.Free(build);
	}
	else
	{
		instr += 1;
	}

	// See FxUnaryNotBoolean for comments, since it's the same thing.
	build->Emit(OP_LI, to.RegNum, 0, 0);
	build->Emit(instr, Operator != TK_Eq, op1.RegNum, op2.RegNum);
	build->Emit(OP_JMP, 1);
	build->Emit(OP_LI, to.RegNum, 1);
	return to;
}